

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rand.cpp
# Opt level: O0

double __thiscall crnlib::random::gaussian(random *this,double mean,double stddev)

{
  bool bVar1;
  double in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  double dVar3;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  double y;
  double x;
  double v;
  double u;
  double q;
  double in_stack_ffffffffffffffc0;
  random *in_stack_ffffffffffffffc8;
  double local_30;
  double local_28;
  
  do {
    local_28 = drand(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_RDI);
    local_30 = drand(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_RDI);
    if ((local_28 <= 0.0) || (local_30 <= 0.0)) {
      local_28 = 1.0;
      local_30 = 1.0;
    }
    dVar2 = (local_30 - 0.5) * 1.7156;
    in_stack_ffffffffffffffc8 = (random *)(local_28 - 0.449871);
    in_stack_ffffffffffffffc0 = ABS(dVar2) + 0.386595;
    dVar3 = (double)in_stack_ffffffffffffffc8 * (double)in_stack_ffffffffffffffc8 +
            in_stack_ffffffffffffffc0 *
            (in_stack_ffffffffffffffc0 * 0.196 - (double)in_stack_ffffffffffffffc8 * 0.25472);
    if (dVar3 < 0.27597) break;
    bVar1 = true;
    if (dVar3 <= 0.27846) {
      dVar3 = log(local_28);
      bVar1 = dVar3 * -4.0 * local_28 * local_28 < dVar2 * dVar2;
    }
  } while (bVar1);
  return in_XMM0_Qa + ((double)CONCAT44(in_XMM1_Db,in_XMM1_Da) * dVar2) / local_28;
}

Assistant:

double random::gaussian(double mean, double stddev) {
  double q, u, v, x, y;

  /*
      Generate P = (u,v) uniform in rect. enclosing acceptance region
      Make sure that any random numbers <= 0 are rejected, since
      gaussian() requires uniforms > 0, but RandomUniform() delivers >= 0.
      */
  do {
    u = drand(0, 1);
    v = drand(0, 1);
    if (u <= 0.0 || v <= 0.0) {
      u = 1.0;
      v = 1.0;
    }
    v = 1.7156 * (v - 0.5);

    /*  Evaluate the quadratic form */
    x = u - 0.449871;
    y = fabs(v) + 0.386595;
    q = x * x + y * (0.19600 * y - 0.25472 * x);

    /* Accept P if inside inner ellipse */
    if (q < 0.27597)
      break;

    /*  Reject P if outside outer ellipse, or outside acceptance region */
  } while ((q > 0.27846) || (v * v > -4.0 * log(u) * u * u));

  /*  Return ratio of P's coordinates as the normal deviate */
  return (mean + stddev * v / u);
}